

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall UdpSocketImpl::~UdpSocketImpl(UdpSocketImpl *this)

{
  _Manager_type p_Var1;
  int iVar2;
  BaseSocket *local_30;
  void *local_28;
  
  (this->super_BaseSocketImpl)._vptr_BaseSocketImpl = (_func_int **)&PTR__UdpSocketImpl_001465c0;
  (this->super_BaseSocketImpl).m_bStop = true;
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)&this->m_mxWrite);
  this->m_bCloseReq = true;
  LOCK();
  (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::condition_variable::notify_all();
  if (iVar2 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxWrite);
  }
  iVar2 = (this->super_BaseSocketImpl).m_fSock;
  if (iVar2 != -1) {
    close(iVar2);
    if ((this->super_BaseSocketImpl).m_fClosingParam.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      if ((this->super_BaseSocketImpl).m_fClosing.super__Function_base._M_manager !=
          (_Manager_type)0x0) {
        local_30 = (this->super_BaseSocketImpl).m_pBkRef;
        (*(this->super_BaseSocketImpl).m_fClosing._M_invoker)
                  ((_Any_data *)&(this->super_BaseSocketImpl).m_fClosing,&local_30);
      }
    }
    else {
      local_28 = (this->super_BaseSocketImpl).m_pvUserData;
      local_30 = (this->super_BaseSocketImpl).m_pBkRef;
      (*(this->super_BaseSocketImpl).m_fClosingParam._M_invoker)
                ((_Any_data *)&(this->super_BaseSocketImpl).m_fClosingParam,&local_30,&local_28);
    }
  }
  p_Var1 = (this->m_fBytesReceivedParam).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_fBytesReceivedParam,(_Any_data *)&this->m_fBytesReceivedParam,
              __destroy_functor);
  }
  p_Var1 = (this->m_fBytesReceived).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_fBytesReceived,(_Any_data *)&this->m_fBytesReceived,
              __destroy_functor);
  }
  std::condition_variable::~condition_variable(&this->m_cv);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~deque(&this->m_quOutData);
  p_Var1 = (this->m_fnSslEncode).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_fnSslEncode,(_Any_data *)&this->m_fnSslEncode,__destroy_functor)
    ;
  }
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~deque(&this->m_quInData);
  p_Var1 = (this->m_fnSslDecode).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_fnSslDecode,(_Any_data *)&this->m_fnSslDecode,__destroy_functor)
    ;
  }
  BaseSocketImpl::~BaseSocketImpl(&this->super_BaseSocketImpl);
  return;
}

Assistant:

UdpSocketImpl::~UdpSocketImpl()
{
    m_bStop = true; // Stops the listening thread
    const bool bIsLocked = m_mxWrite.try_lock();
    m_bCloseReq = true;
    m_atOutBytes = 0;
    m_cv.notify_all();
    if (bIsLocked == true)
        m_mxWrite.unlock();

    if (m_fSock != INVALID_SOCKET)
    {
        ::closesocket(m_fSock);

        if (m_fClosingParam)
            m_fClosingParam(m_pBkRef, m_pvUserData);
        else if (m_fClosing)
            m_fClosing(m_pBkRef);
    }
}